

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.h
# Opt level: O0

Node * __thiscall HashMap<int>::first(HashMap<int> *this,uint hash)

{
  Node *local_28;
  Node *curr;
  uint bucket;
  uint hash_local;
  HashMap<int> *this_local;
  
  local_28 = this->entries[hash & 0x3ff];
  while( true ) {
    if (local_28 == (Node *)0x0) {
      return (Node *)0x0;
    }
    if (local_28->hash == hash) break;
    local_28 = local_28->next;
  }
  return local_28;
}

Assistant:

Node* first(unsigned int hash)
	{
		unsigned int bucket = hash & bucketMask;
		Node *curr = entries[bucket];
		while(curr)
		{
			if(curr->hash == hash)
				return curr;
			curr = curr->next;
		}
		return NULL;
	}